

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

shared_ptr<const_pstore::index::details::linear_node> __thiscall
pstore::database::getro<pstore::index::details::linear_node,void>
          (database *this,typed_address<pstore::index::details::linear_node> addr,size_t elements)

{
  value_type vVar1;
  address size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_pstore::index::details::linear_node> sVar2;
  address local_30;
  size_t elements_local;
  database *this_local;
  typed_address<pstore::index::details::linear_node> addr_local;
  
  elements_local = (size_t)addr.a_.a_;
  this_local = (database *)elements;
  addr_local.a_.a_ = (address)(address)this;
  local_30 = typed_address<pstore::index::details::linear_node>::to_address
                       ((typed_address<pstore::index::details::linear_node> *)&this_local);
  vVar1 = address::absolute(&stack0xffffffffffffffd0);
  if ((vVar1 & 7) != 0) {
    raise<pstore::error_code>(bad_alignment);
  }
  size = typed_address<pstore::index::details::linear_node>::to_address
                   ((typed_address<pstore::index::details::linear_node> *)&this_local);
  getro((database *)&stack0xffffffffffffffc0,addr.a_.a_,size.a_);
  std::static_pointer_cast<pstore::index::details::linear_node_const,void_const>
            ((shared_ptr<const_void> *)this);
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)&stack0xffffffffffffffc0);
  sVar2.super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<const_pstore::index::details::linear_node>)
         sVar2.
         super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T const> getro (typed_address<T> const addr,
                                        std::size_t const elements) const {
            if (addr.to_address ().absolute () % alignof (T) != 0) {
                raise (error_code::bad_alignment);
            }
            return std::static_pointer_cast<T const> (
                this->getro (addr.to_address (), sizeof (T) * elements));
        }